

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImGuiContext *pIVar2;
  ImU32 col;
  ImGuiContext *g;
  undefined7 in_register_00000039;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  fVar5 = pIVar2->FontSize * 0.4 * scale;
  fVar6 = pIVar2->FontSize * 0.5;
  fVar7 = fVar6 + p_min.x;
  fVar6 = scale * fVar6 + p_min.y;
  if ((int)CONCAT71(in_register_00000039,is_open) == 0) {
    fVar8 = fVar5 * 0.0 + fVar6;
    fVar3 = fVar5 * -0.5 + fVar7;
    fVar4 = fVar6 + fVar5 * 0.866;
    fVar6 = fVar6 - fVar5 * 0.866;
    fVar9 = fVar3;
  }
  else {
    fVar6 = fVar5 * -0.25 + fVar6;
    fVar8 = fVar5 + fVar6;
    fVar3 = fVar7 - fVar5 * 0.866;
    fVar4 = fVar6 - fVar5 * 0.5;
    fVar9 = fVar5 * 0.866 + fVar7;
    fVar6 = fVar4;
    fVar5 = fVar5 * 0.0;
  }
  local_28.y = fVar8;
  local_28.x = fVar5 + fVar7;
  local_30.y = fVar4;
  local_30.x = fVar3;
  local_38.y = fVar6;
  local_38.x = fVar9;
  this = pIVar1->DrawList;
  col = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(this,&local_28,&local_30,&local_38,col);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}